

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

int __thiscall
vera::TriangulatorData::AddTriangle
          (TriangulatorData *this,int a,int b,int c,int ab,int bc,int ca,int e)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  int local_34;
  value_type_conflict5 local_30;
  int t;
  int local_28;
  value_type local_24;
  int local_20;
  int bc_local;
  int ab_local;
  int c_local;
  int b_local;
  int a_local;
  TriangulatorData *this_local;
  
  local_24 = bc;
  local_20 = ab;
  bc_local = c;
  ab_local = b;
  c_local = a;
  _b_local = this;
  if (e < 0) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->triangles);
    e = (int)sVar4;
    std::vector<int,_std::allocator<int>_>::push_back(&this->triangles,&c_local);
    std::vector<int,_std::allocator<int>_>::push_back(&this->triangles,&ab_local);
    std::vector<int,_std::allocator<int>_>::push_back(&this->triangles,&bc_local);
    std::vector<int,_std::allocator<int>_>::push_back(&this->halfedges,&local_20);
    std::vector<int,_std::allocator<int>_>::push_back(&this->halfedges,&local_24);
    std::vector<int,_std::allocator<int>_>::push_back(&this->halfedges,&ca);
    local_28 = 0;
    std::
    vector<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
    ::emplace_back<int>(&this->candidates,&local_28);
    t = 0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->errors,(value_type_conflict *)&t);
    local_30 = -1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->queueIndexes,&local_30);
  }
  else {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->triangles,(long)e);
    iVar3 = ab_local;
    *pvVar5 = a;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->triangles,(long)(e + 1));
    iVar2 = bc_local;
    *pvVar5 = iVar3;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->triangles,(long)(e + 2));
    iVar3 = local_20;
    *pvVar5 = iVar2;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->halfedges,(long)e);
    vVar1 = local_24;
    *pvVar5 = iVar3;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->halfedges,(long)(e + 1));
    iVar3 = ca;
    *pvVar5 = vVar1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->halfedges,(long)(e + 2));
    *pvVar5 = iVar3;
  }
  iVar3 = e;
  if (-1 < local_20) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->halfedges,(long)local_20);
    *pvVar5 = iVar3;
  }
  if (-1 < local_24) {
    iVar3 = e + 1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->halfedges,(long)local_24);
    *pvVar5 = iVar3;
  }
  if (-1 < ca) {
    iVar3 = e + 2;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->halfedges,(long)ca);
    *pvVar5 = iVar3;
  }
  local_34 = e / 3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->pending,&local_34);
  return e;
}

Assistant:

int AddTriangle(const int a, const int b, const int c,
                    const int ab, const int bc, const int ca,
                    int e) {
        if (e < 0) {
            // new halfedge index
            e = triangles.size();
            // add triangle vertices
            triangles.push_back(a);
            triangles.push_back(b);
            triangles.push_back(c);
            // add triangle halfedges
            halfedges.push_back(ab);
            halfedges.push_back(bc);
            halfedges.push_back(ca);
            // add triangle metadata
            candidates.emplace_back(0);
            errors.push_back(0);
            queueIndexes.push_back(-1);
        } 
        else {
            // set triangle vertices
            triangles[e + 0] = a;
            triangles[e + 1] = b;
            triangles[e + 2] = c;
            // set triangle halfedges
            halfedges[e + 0] = ab;
            halfedges[e + 1] = bc;
            halfedges[e + 2] = ca;
        }

        // link neighboring halfedges
        if (ab >= 0)
            halfedges[ab] = e + 0;
        if (bc >= 0)
            halfedges[bc] = e + 1;
        if (ca >= 0)
            halfedges[ca] = e + 2;

        // add triangle to pending queue for later rasterization
        const int t = e / 3;
        pending.push_back(t);

        // return first halfedge index
        return e;
    }